

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

char * Wln_ObjConstString(Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  char *pcVar3;
  
  iVar1 = Wln_ObjIsConst(p,iObj);
  if (iVar1 != 0) {
    paVar2 = &p->vFanins[iObj].field_2;
    if (2 < p->vFanins[iObj].nSize) {
      paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
    }
    pcVar3 = Abc_NamStr(p->pManName,paVar2->Array[0]);
    return pcVar3;
  }
  __assert_fail("Wln_ObjIsConst(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                ,0x37,"char *Wln_ObjConstString(Wln_Ntk_t *, int)");
}

Assistant:

char * Wln_ObjConstString( Wln_Ntk_t * p, int iObj )
{
    assert( Wln_ObjIsConst(p, iObj) );
    return Abc_NamStr( p->pManName, Wln_ObjFanin0(p, iObj) );
}